

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleSetTipPartials(int instance,int tipIndex,double *inPartials)

{
  BeagleImpl *pBVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  bad_alloc *anon_var_0;
  out_of_range *anon_var_0_1;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffffac;
  undefined4 local_4;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffffac);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)pBVar1 + 0x30))(pBVar1,in_ESI,in_RDX);
  }
  return local_4;
}

Assistant:

int beagleSetTipPartials(int instance,
                   int tipIndex,
                   const double* inPartials) {
    DEBUG_START_TIME();
    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->setTipPartials(tipIndex, inPartials);
        DEBUG_END_TIME();
        return returnValue;
    }
    catch (std::bad_alloc &) {
        return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    catch (std::out_of_range &) {
        return BEAGLE_ERROR_OUT_OF_RANGE;
    }
    catch (...) {
        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
    }
}